

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler * llama_sampler_chain_clone(llama_sampler *smpl)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  llama_sampler *chain;
  llama_sampler *smpl_00;
  undefined8 *puVar3;
  
  puVar1 = (undefined4 *)smpl->ctx;
  chain = llama_sampler_chain_init((llama_sampler_chain_params)SUB41(*puVar1,0));
  puVar2 = *(undefined8 **)(puVar1 + 4);
  for (puVar3 = *(undefined8 **)(puVar1 + 2); puVar3 != puVar2; puVar3 = puVar3 + 1) {
    smpl_00 = llama_sampler_clone((llama_sampler *)*puVar3);
    llama_sampler_chain_add(chain,smpl_00);
  }
  return chain;
}

Assistant:

static struct llama_sampler * llama_sampler_chain_clone(const struct llama_sampler * smpl) {
    const auto * chain_src = (const llama_sampler_chain *) smpl->ctx;

    auto * result = llama_sampler_chain_init(chain_src->params);

    for (auto * smpl : chain_src->samplers) {
        llama_sampler_chain_add(result, llama_sampler_clone(smpl));
    }

    return result;
}